

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutil.h
# Opt level: O3

File * ctemplate::File::Open(char *filename,char *mode)

{
  char cVar1;
  FILE *pFVar2;
  File *pFVar3;
  char binary_mode [3];
  char local_b [3];
  
  cVar1 = *mode;
  if (((cVar1 == 'w') || (cVar1 == 'r')) && (mode[1] == '\0')) {
    mode = local_b;
    local_b[1] = 'b';
    local_b[2] = '\0';
    local_b[0] = cVar1;
  }
  pFVar2 = fopen(filename,mode);
  if (pFVar2 == (FILE *)0x0) {
    pFVar3 = (File *)0x0;
  }
  else {
    pFVar3 = (File *)operator_new(8);
    pFVar3->fp_ = (FILE *)pFVar2;
  }
  return pFVar3;
}

Assistant:

static File* Open(const char* filename, const char* mode) {
    char binary_mode[3];
    const char* mode_to_use = mode;
    if ((mode[0] == 'r' || mode[0] == 'w') && mode[1] == '\0') {
      // We add a 'b' to make sure we do the right thing even on
      // Windows.  On unix, this will be a noop.
      binary_mode[0] = mode[0];
      binary_mode[1] = 'b';
      binary_mode[2] = '\0';
      mode_to_use = binary_mode;
    }
    FILE* fp = fopen(filename, mode_to_use);
    if (!fp)  return NULL;
    return new File(fp);
  }